

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfDynamicInfo.cpp
# Opt level: O2

DynamicList * __thiscall
libelfxx::ElfDynamicInfo::find
          (DynamicList *__return_storage_ptr__,ElfDynamicInfo *this,uint64_t tag)

{
  const_iterator cVar1;
  const_iterator cVar2;
  const_iterator itr;
  uint64_t local_30;
  uint64_t tag_local;
  
  local_30 = tag;
  cVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>,_std::_Select1st<std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>_>_>
          ::upper_bound(&(this->_dyns)._M_t,&local_30);
  cVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>,_std::_Select1st<std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libelfxx::ElfDynamic_*>_>_>
          ::lower_bound(&(this->_dyns)._M_t,&local_30);
  (__return_storage_ptr__->
  super__Vector_base<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; cVar2._M_node != cVar1._M_node;
      cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node)) {
    std::vector<libelfxx::ElfDynamic,_std::allocator<libelfxx::ElfDynamic>_>::push_back
              (__return_storage_ptr__,(value_type *)cVar2._M_node[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

ElfDynamicInfo::DynamicList ElfDynamicInfo::find(uint64_t tag) const
{
  auto upper_bound = _dyns.upper_bound(tag);
  auto lower_bound = _dyns.lower_bound(tag);
  DynamicList rv;
  for (auto itr = lower_bound;itr != upper_bound;++itr) {
    rv.push_back(*itr->second);
  }
  return rv;
}